

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger base_setconsttable(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  long in_RDI;
  SQObjectPtr o;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HSQUIRRELVM in_stack_ffffffffffffffd8;
  SQObjectPtr local_20;
  SQInteger local_8;
  
  SQObjectPtr::SQObjectPtr(&local_20,(SQObjectPtr *)(*(long *)(in_RDI + 0x118) + 0x68));
  o_00 = (SQObjectPtr *)sq_setconsttable(in_stack_ffffffffffffffd8);
  if ((long)o_00 < 0) {
    local_8 = -1;
  }
  else {
    SQVM::Push((SQVM *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),o_00);
    local_8 = 1;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffffd4,1));
  return local_8;
}

Assistant:

static SQInteger base_setconsttable(HSQUIRRELVM v)
{
    SQObjectPtr o = _ss(v)->_consts;
    if(SQ_FAILED(sq_setconsttable(v))) return SQ_ERROR;
    v->Push(o);
    return 1;
}